

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrActionSuggestedBinding *value)

{
  ValidateXrHandleResult VVar1;
  string local_248 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  allocator local_209;
  string local_208 [32];
  XrAction_T local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrResult xr_result;
  XrActionSuggestedBinding *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if (check_members) {
    VVar1 = VerifyXrActionHandle(&value->action);
    if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
      instance_info_local._4_4_ = XR_SUCCESS;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      std::operator<<((ostream *)local_1b8,"Invalid XrAction handle \"action\" ");
      HandleToHexString<XrAction_T*>(local_1e8);
      std::operator<<((ostream *)local_1b8,(string *)local_1e8);
      std::__cxx11::string::~string((string *)local_1e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_208,"VUID-XrActionSuggestedBinding-action-parameter",&local_209);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_228,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_208,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_228,local_248);
      std::__cxx11::string::~string((string *)local_248);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_228);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      instance_info_local._4_4_ = XR_ERROR_HANDLE_INVALID;
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
    }
  }
  else {
    instance_info_local._4_4_ = XR_SUCCESS;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrActionSuggestedBinding* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    {
        // writeValidateInlineHandleValidation
        ValidateXrHandleResult handle_result = VerifyXrActionHandle(&value->action);
        if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
            // Not a valid handle or NULL (which is not valid in this case)
            std::ostringstream oss;
            oss << "Invalid XrAction handle \"action\" ";
            oss << HandleToHexString(value->action);
            CoreValidLogMessage(instance_info, "VUID-XrActionSuggestedBinding-action-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, oss.str());
            return XR_ERROR_HANDLE_INVALID;
        }
    }
    // Everything checked out properly
    return xr_result;
}